

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall chaiscript::parser::ChaiScript_Parser::Statements(ChaiScript_Parser *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  eval_error *peVar7;
  bool bVar8;
  bool bVar9;
  string local_50;
  File_Position local_30;
  
  bVar8 = true;
  bVar4 = false;
  do {
    iVar1 = (this->m_position).line;
    iVar2 = (this->m_position).col;
    bVar5 = Def(this,false);
    local_30.line = iVar1;
    local_30.column = iVar2;
    if (bVar5) {
LAB_001622f0:
      bVar9 = true;
      bVar5 = true;
      bVar3 = true;
      if (!bVar8) {
        peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Two function definitions missing line separator","");
        exception::eval_error::eval_error
                  (peVar7,&local_50,&local_30,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    else {
      bVar5 = Try(this);
      if (bVar5) goto LAB_001622f0;
      bVar5 = If(this);
      if (bVar5) goto LAB_001622f0;
      bVar5 = While(this);
      if (bVar5) goto LAB_001622f0;
      bVar5 = Class(this);
      if (bVar5) goto LAB_001622f0;
      bVar5 = For(this);
      if (bVar5) goto LAB_001622f0;
      bVar5 = Switch(this);
      if (bVar5) goto LAB_001622f0;
      bVar5 = Return(this);
      if (bVar5) {
LAB_0016233b:
        if (!bVar8) {
          peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Two expressions missing line separator","");
          exception::eval_error::eval_error
                    (peVar7,&local_50,&local_30,
                     (this->m_filename).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        bVar9 = true;
        bVar5 = true;
        bVar3 = false;
      }
      else {
        bVar5 = Break(this);
        if (bVar5) goto LAB_0016233b;
        bVar5 = Continue(this);
        if (bVar5) goto LAB_0016233b;
        bVar5 = Equation(this);
        if (bVar5) goto LAB_0016233b;
        bVar6 = Block(this);
        bVar9 = true;
        bVar5 = true;
        bVar3 = true;
        if (!bVar6) {
          bVar6 = Eol(this);
          bVar9 = true;
          bVar5 = true;
          bVar3 = true;
          if (!bVar6) {
            bVar9 = false;
            bVar5 = bVar4;
            bVar3 = bVar8;
          }
        }
      }
    }
    bVar8 = bVar3;
    bVar4 = bVar5;
    if (!bVar9) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool Statements() {
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def() || Try() || If() || While() || Class() || For() || Switch()) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          }
          else if (Return() || Break() || Continue() || Equation()) {
            if (!saw_eol) {
              throw exception::eval_error("Two expressions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = false;
          }
          else if (Block() || Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          }
          else {
            has_more = false;
          }
        }

        return retval;
      }